

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,Select *pSelect,
                      int isTemp,int noErr)

{
  sqlite3 *db;
  Table *pTable;
  Db *pDVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  Select *pSVar7;
  uint uVar8;
  Schema **ppSVar9;
  Token sEnd;
  Token *pName;
  DbFixer sFix;
  Token local_78;
  Token *local_68;
  Token *local_60;
  DbFixer local_58;
  
  local_68 = (Token *)0x0;
  db = pParse->db;
  if (pParse->nVar < 1) {
    local_60 = pBegin;
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTable = pParse->pNewTable;
    if ((pTable != (Table *)0x0) && (pParse->nErr == 0)) {
      sqlite3TwoPartName(pParse,pName1,pName2,&local_68);
      if (pTable->pSchema == (Schema *)0x0) {
        uVar6 = 0xfff0bdc0;
      }
      else {
        uVar8 = db->nDb;
        if ((int)uVar8 < 1) {
          uVar6 = 0;
        }
        else {
          ppSVar9 = &db->aDb->pSchema;
          uVar5 = 0;
          do {
            uVar6 = uVar5;
            if (*ppSVar9 == pTable->pSchema) break;
            uVar5 = uVar5 + 1;
            ppSVar9 = ppSVar9 + 4;
            uVar6 = (ulong)uVar8;
          } while (uVar8 != uVar5);
        }
      }
      if ((int)uVar6 != 1 && -1 < (int)uVar6) {
        pDVar1 = pParse->db->aDb;
        local_58.zDb = pDVar1[uVar6 & 0xffffffff].zName;
        local_58.pSchema = pDVar1[uVar6 & 0xffffffff].pSchema;
        local_58.zType = "view";
        local_58.pName = local_68;
        local_58.pParse = pParse;
        iVar4 = sqlite3FixSelect(&local_58,pSelect);
        if (iVar4 != 0) goto LAB_0017a6e2;
      }
      pSVar7 = sqlite3SelectDup(db,pSelect,1);
      pTable->pSelect = pSVar7;
      sqlite3SelectDelete(db,pSelect);
      if (db->mallocFailed == '\0') {
        if ((db->init).busy == '\0') {
          sqlite3ViewGetColumnNames(pParse,pTable);
        }
        local_78.z = (pParse->sLastToken).z;
        uVar6 = *(ulong *)&(pParse->sLastToken).n;
        if ((*local_78.z != '\0') && (*local_78.z != ';')) {
          local_78.z = local_78.z + (uVar6 & 0xffffffff);
        }
        pcVar2 = local_60->z;
        uVar8 = (int)local_78.z - (int)pcVar2;
        if (0 < (int)uVar8) {
          do {
            if ((""[(byte)pcVar2[(ulong)uVar8 - 1]] & 1) == 0) goto LAB_0017a880;
            bVar3 = 1 < (int)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar3);
          uVar8 = 0;
        }
LAB_0017a880:
        local_78.z = pcVar2 + (long)(int)uVar8 + -1;
        local_78._12_4_ = (int)(uVar6 >> 0x20);
        local_78.n = 1;
        sqlite3EndTable(pParse,(Token *)0x0,&local_78,(Select *)0x0);
      }
      return;
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
  }
LAB_0017a6e2:
  sqlite3SelectDelete(db,pSelect);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  if( sqlite3FixInit(&sFix, pParse, iDb, "view", pName)
    && sqlite3FixSelect(&sFix, pSelect)
  ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  p->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  sqlite3SelectDelete(db, pSelect);
  if( db->mallocFailed ){
    return;
  }
  if( !db->init.busy ){
    sqlite3ViewGetColumnNames(pParse, p);
  }

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  if( ALWAYS(sEnd.z[0]!=0) && sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  z = pBegin->z;
  while( ALWAYS(n>0) && sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the SQLITE_MASTER table */
  sqlite3EndTable(pParse, 0, &sEnd, 0);
  return;
}